

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool QSslSocketPrivate::isMatchingHostname(QSslCertificate *cert,QString *peerName)

{
  bool bVar1;
  const_iterator o;
  QList<QString> *in_RSI;
  long in_FS_OFFSET;
  QString *commonName;
  QStringList *__range1;
  const_iterator it_1;
  pair<QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator,_QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator>
  altNames;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> subjectAlternativeNames;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList commonNames;
  QString lowerPeerName;
  const_iterator it;
  pair<QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator,_QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator>
  ipAddresses;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> subjectAlternativeNames_1;
  QHostAddress hostAddress;
  undefined4 in_stack_fffffffffffffed8;
  ConversionModeFlag in_stack_fffffffffffffedc;
  const_iterator *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  QString *in_stack_fffffffffffffef0;
  QSslCertificate *in_stack_fffffffffffffef8;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> *this;
  byte local_d9;
  QHostAddress *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff58;
  const_iterator local_a0;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> local_98;
  QString *hostname;
  QString *cn;
  undefined1 local_7c [4];
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  const_iterator local_38;
  undefined4 local_2c;
  pair<QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator,_QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator>
  local_28;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress
            ((QHostAddress *)in_stack_fffffffffffffef0,
             (QString *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  bVar1 = QHostAddress::isNull((QHostAddress *)0x3a79e4);
  if (!bVar1) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    QSslCertificate::subjectAlternativeNames
              ((QSslCertificate *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    local_28.second.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_28.first.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_2c = 2;
    local_28 = QMultiMap<QSsl::AlternativeNameEntryType,_QString>::equal_range
                         ((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)
                          in_stack_fffffffffffffef8,
                          (AlternativeNameEntryType *)in_stack_fffffffffffffef0);
    local_38 = local_28.first.i._M_node;
    while (bVar1 = ::operator!=(in_stack_fffffffffffffee0,
                                (const_iterator *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
          bVar1) {
      QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::operator*
                ((const_iterator *)0x3a7aa9);
      QHostAddress::QHostAddress
                ((QHostAddress *)in_stack_fffffffffffffef0,
                 (QString *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      QFlags<QHostAddress::ConversionModeFlag>::QFlags
                ((QFlags<QHostAddress::ConversionModeFlag> *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffedc);
      in_stack_fffffffffffffeef =
           QHostAddress::isEqual
                     ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28,
                      (QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>)
                      SUB84((ulong)in_stack_ffffffffffffff58 >> 0x20,0));
      QHostAddress::~QHostAddress((QHostAddress *)0x3a7af5);
      if ((in_stack_fffffffffffffeef & 1) != 0) {
        local_d9 = 1;
        bVar1 = true;
        goto LAB_003a7b31;
      }
      QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::operator++
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
    bVar1 = false;
LAB_003a7b31:
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::~QMultiMap
              ((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)0x3a7b3e);
    if (bVar1) goto LAB_003a7df8;
  }
  local_60 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  memset(local_7c,0,4);
  QFlags<QUrl::AceProcessingOption>::QFlags((QFlags<QUrl::AceProcessingOption> *)0x3a7ba6);
  QUrl::toAce((QString *)local_78,(QFlags_conflict *)in_RSI);
  QString::fromLatin1<void>((QByteArray *)in_RSI);
  QByteArray::~QByteArray((QByteArray *)0x3a7be1);
  local_98.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  hostname = (QString *)0xaaaaaaaaaaaaaaaa;
  cn = (QString *)0xaaaaaaaaaaaaaaaa;
  QSslCertificate::subjectInfo
            (in_stack_fffffffffffffef8,(SubjectInfo)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  this = &local_98;
  local_a0.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_a0 = QList<QString>::begin(in_RSI);
  o = QList<QString>::end(in_RSI);
  while (bVar1 = QList<QString>::const_iterator::operator!=(&local_a0,o), bVar1) {
    in_stack_fffffffffffffef0 = QList<QString>::const_iterator::operator*(&local_a0);
    bVar1 = isMatchingHostname(cn,hostname);
    if (bVar1) {
      local_d9 = 1;
      goto LAB_003a7dde;
    }
    QList<QString>::const_iterator::operator++(&local_a0);
  }
  QSslCertificate::subjectAlternativeNames
            ((QSslCertificate *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  QMultiMap<QSsl::AlternativeNameEntryType,_QString>::equal_range
            (this,(AlternativeNameEntryType *)in_stack_fffffffffffffef0);
  while (bVar1 = ::operator!=((const_iterator *)in_RSI,
                              (const_iterator *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)), bVar1)
  {
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::operator*
              ((const_iterator *)0x3a7d94);
    bVar1 = isMatchingHostname(cn,hostname);
    if (bVar1) {
      local_d9 = 1;
      goto LAB_003a7dd4;
    }
    QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator::operator++
              ((const_iterator *)in_RSI);
  }
  local_d9 = 0;
LAB_003a7dd4:
  QMultiMap<QSsl::AlternativeNameEntryType,_QString>::~QMultiMap
            ((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)0x3a7dde);
LAB_003a7dde:
  QList<QString>::~QList((QList<QString> *)0x3a7deb);
  QString::~QString((QString *)0x3a7df8);
LAB_003a7df8:
  QHostAddress::~QHostAddress((QHostAddress *)0x3a7e05);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_d9 & 1);
}

Assistant:

bool QSslSocketPrivate::isMatchingHostname(const QSslCertificate &cert, const QString &peerName)
{
    QHostAddress hostAddress(peerName);
    if (!hostAddress.isNull()) {
        const auto subjectAlternativeNames = cert.subjectAlternativeNames();
        const auto ipAddresses = subjectAlternativeNames.equal_range(QSsl::AlternativeNameEntryType::IpAddressEntry);

        for (auto it = ipAddresses.first; it != ipAddresses.second; it++) {
            if (QHostAddress(*it).isEqual(hostAddress, QHostAddress::StrictConversion))
                return true;
        }
    }

    const QString lowerPeerName = QString::fromLatin1(QUrl::toAce(peerName));
    const QStringList commonNames = cert.subjectInfo(QSslCertificate::CommonName);

    for (const QString &commonName : commonNames) {
        if (isMatchingHostname(commonName, lowerPeerName))
            return true;
    }

    const auto subjectAlternativeNames = cert.subjectAlternativeNames();
    const auto altNames = subjectAlternativeNames.equal_range(QSsl::DnsEntry);
    for (auto it = altNames.first; it != altNames.second; ++it) {
        if (isMatchingHostname(*it, lowerPeerName))
            return true;
    }

    return false;
}